

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smpdtfmt.cpp
# Opt level: O2

TimeZoneFormat * __thiscall icu_63::SimpleDateFormat::getTimeZoneFormat(SimpleDateFormat *this)

{
  uint in_EAX;
  TimeZoneFormat *pTVar1;
  UErrorCode status;
  undefined8 uStack_8;
  
  uStack_8 = (ulong)in_EAX;
  pTVar1 = tzFormat(this,(UErrorCode *)((long)&uStack_8 + 4));
  return pTVar1;
}

Assistant:

const TimeZoneFormat*
SimpleDateFormat::getTimeZoneFormat(void) const {
    // TimeZoneFormat initialization might fail when out of memory.
    // If we always initialize TimeZoneFormat instance, we can return
    // such status there. For now, this implementation lazily instantiates
    // a TimeZoneFormat for performance optimization reasons, but cannot
    // propagate such error (probably just out of memory case) to the caller.
    UErrorCode status = U_ZERO_ERROR;
    return (const TimeZoneFormat*)tzFormat(status);
}